

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowManager.cpp
# Opt level: O3

bool __thiscall gui::CWindowManager::Draw(CWindowManager *this,IFrameBuffer *fb,TRect *dirtyRect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  TPoint TVar5;
  element_type *peVar6;
  pointer psVar7;
  CImageData *this_00;
  element_type *peVar8;
  bool bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool in_R9B;
  TRect client;
  TRect TVar10;
  TRect local_40;
  
  TVar5 = (TPoint)(this->m_desktop).super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
  TVar10.p1 = TVar5;
  TVar10.p0 = *(TPoint *)((long)TVar5 + 0x720);
  bVar9 = DrawWindow((gui *)fb,(IFrameBuffer *)((TRect *)((long)TVar5 + 0x718))->p0,TVar10,
                     (CWindow *)0x0,in_R9B);
  if ((bVar9) || (this->m_mouseDirty == true)) {
    peVar6 = (this->m_cursor).super___shared_ptr<gui::CCursor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar7 = (peVar6->m_images).
             super__Vector_base<std::shared_ptr<gui::CImageData>,_std::allocator<std::shared_ptr<gui::CImageData>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((peVar6->m_images).
        super__Vector_base<std::shared_ptr<gui::CImageData>,_std::allocator<std::shared_ptr<gui::CImageData>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar7) {
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (psVar7->super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (psVar7->super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      if (this_00 != (CImageData *)0x0) {
        client.p1 = (TPoint)(this->m_desktop).
                            super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        client.p0 = (this->m_oldMouseRect).p1;
        DrawWindow((gui *)fb,(IFrameBuffer *)(this->m_oldMouseRect).p0,client,(CWindow *)0x1,in_R9B)
        ;
        uVar1 = this_00->m_xh;
        uVar3 = this_00->m_yh;
        local_40.p0.x = (this->m_mousePosition).x - uVar1;
        local_40.p0.y = (this->m_mousePosition).y - uVar3;
        uVar2 = this_00->m_width;
        uVar4 = this_00->m_height;
        local_40.p1.x = uVar2 + local_40.p0.x;
        local_40.p1.y = uVar4 + local_40.p0.y;
        CImageData::Draw(this_00,fb,local_40.p0.x,local_40.p0.y);
        TVar10 = TRect::Union(&this->m_oldMouseRect,&local_40);
        *dirtyRect = TVar10;
        this->m_mouseDirty = false;
        (this->m_oldMouseRect).p0 = local_40.p0;
        (this->m_oldMouseRect).p1 = local_40.p1;
      }
    }
    if (bVar9) {
      peVar8 = (this->m_desktop).super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      TVar5 = (peVar8->m_rect).p1;
      dirtyRect->p0 = (peVar8->m_rect).p0;
      dirtyRect->p1 = TVar5;
    }
    bVar9 = true;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool CWindowManager::Draw(IFrameBuffer &fb, TRect &dirtyRect) {
    auto dirty = DrawWindow(fb, m_desktop->GetRect(), *m_desktop.get(), false);
    if (!dirty && !m_mouseDirty) {
        return false;
    }

    // TODO: handle hotspot
    auto cursor = m_cursor->GetCursor();
    if (cursor) {
        // Clear the old pointer first
        DrawWindow(fb, m_oldMouseRect, *m_desktop.get(), true);

        // Draw the new pointer
        auto x = m_mousePosition.x - cursor->GetXHotspot();
        auto y = m_mousePosition.y - cursor->GetYHotspot();
        TRect rect(x, y, x + cursor->GetWidth(), y + cursor->GetHeight());

        cursor->Draw(fb, x, y);
        dirtyRect = TRect::Union(m_oldMouseRect, rect);
        m_mouseDirty = false;
        m_oldMouseRect = rect;
    }

    if (dirty) {
        dirtyRect = m_desktop->GetRect();
    }

    return true;
}